

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O0

int __thiscall
CGraphicsBackend_SDL_OpenGL::Init
          (CGraphicsBackend_SDL_OpenGL *this,char *pName,int *pScreen,int *pWindowWidth,
          int *pWindowHeight,int *pScreenWidth,int *pScreenHeight,int FsaaSamples,int Flags,
          int *pDesktopWidth,int *pDesktopHeight)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  uchar *puVar8;
  void *pvVar9;
  int *in_RCX;
  int *in_RDX;
  undefined8 in_RSI;
  uint uVar10;
  CCommandBuffer *in_RDI;
  int *in_R8;
  undefined8 in_R9;
  uint uVar11;
  long in_FS_OFFSET;
  undefined8 in_stack_00000008;
  int in_stack_00000010;
  uint in_stack_00000018;
  int *in_stack_00000020;
  int *in_stack_00000028;
  SDL_version Compiled;
  int OffsetY;
  int OffsetX;
  int SdlFlags;
  CInitCommand CmdOpenGL;
  CInitCommand CmdSDL;
  CCommandBuffer CmdBuffer;
  SDL_version Linked;
  SDL_Rect ScreenPos;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef4;
  CCommandBuffer *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int local_d4;
  int local_d0;
  uint local_cc;
  int local_94;
  undefined1 local_50 [53];
  byte local_1b;
  byte local_1a;
  byte local_19;
  int local_18;
  int local_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = SDL_WasInit(0x20);
  if ((iVar4 == 0) && (iVar4 = SDL_InitSubSystem(0x20), iVar4 < 0)) {
    uVar6 = SDL_GetError();
    dbg_msg("gfx","unable to init SDL video: %s",uVar6);
    local_94 = -1;
  }
  else {
    uVar5 = SDL_GetNumVideoDisplays();
    *(undefined4 *)((long)&in_RDI[2].m_pCmdBufferHead + 4) = uVar5;
    if (*(int *)((long)&in_RDI[2].m_pCmdBufferHead + 4) < 1) {
      uVar6 = SDL_GetError();
      dbg_msg("gfx","unable to retrieve number of screens: %s",uVar6);
      local_94 = -1;
    }
    else {
      iVar4 = clamp<int>(*in_RDX,0,*(int *)((long)&in_RDI[2].m_pCmdBufferHead + 4) + -1);
      *in_RDX = iVar4;
      iVar4 = SDL_GetDisplayBounds(*in_RDX,&local_18);
      if (iVar4 == 0) {
        uVar7 = (**(code **)((in_RDI->m_CmdBuffer).m_pData + 0x68))
                          (in_RDI,*in_RDX,in_stack_00000020,in_stack_00000028);
        if ((uVar7 & 1) == 0) {
          uVar6 = SDL_GetError();
          dbg_msg("gfx","unable to get desktop resolution: %s",uVar6);
          local_94 = -1;
        }
        else {
          if ((*in_RCX == 0) || (*in_R8 == 0)) {
            *in_RCX = *in_stack_00000020;
            *in_R8 = *in_stack_00000028;
          }
          local_cc = 2;
          if ((in_stack_00000018 & 0x20) != 0) {
            local_cc = 0x2002;
          }
          if ((in_stack_00000018 & 4) != 0) {
            local_cc = local_cc | 0x20;
          }
          if ((in_stack_00000018 & 8) != 0) {
            local_cc = local_cc | 0x10;
          }
          if ((in_stack_00000018 & 1) != 0) {
            local_cc = local_cc | 1;
          }
          if ((in_stack_00000018 & 0x10) != 0) {
            SDL_SetHint("SDL_VIDEO_X11_XRANDR","1");
          }
          SDL_GL_SetAttribute(5,1);
          if (in_stack_00000010 == 0) {
            SDL_GL_SetAttribute(0xd,0);
            SDL_GL_SetAttribute(0xe,0);
          }
          else {
            SDL_GL_SetAttribute(0xd,1);
            SDL_GL_SetAttribute(0xe,in_stack_00000010);
          }
          local_d0 = 0;
          local_d4 = 0;
          if ((((in_stack_00000018 & 1) == 0) && (*in_RCX < *in_stack_00000020)) &&
             (*in_R8 < *in_stack_00000028)) {
            local_d0 = (*in_stack_00000020 - *in_RCX) / 2;
            local_d4 = (*in_stack_00000028 - *in_R8) / 2;
          }
          uVar6 = SDL_CreateWindow(in_RSI,local_18 + local_d0,local_14 + local_d4,*in_RCX,*in_R8,
                                   local_cc);
          in_RDI[2].m_CmdBuffer.m_Size = (int)uVar6;
          in_RDI[2].m_CmdBuffer.m_Used = (int)((ulong)uVar6 >> 0x20);
          lVar1._0_4_ = in_RDI[2].m_CmdBuffer.m_Size;
          lVar1._4_4_ = in_RDI[2].m_CmdBuffer.m_Used;
          if (lVar1 == 0) {
            uVar6 = SDL_GetError();
            dbg_msg("gfx","unable to create window: %s",uVar6);
            local_94 = -1;
          }
          else {
            uVar6._0_4_ = in_RDI[2].m_CmdBuffer.m_Size;
            uVar6._4_4_ = in_RDI[2].m_CmdBuffer.m_Used;
            SDL_GetWindowSize(uVar6,in_RCX,in_R8);
            uVar2._0_4_ = in_RDI[2].m_CmdBuffer.m_Size;
            uVar2._4_4_ = in_RDI[2].m_CmdBuffer.m_Used;
            puVar8 = (uchar *)SDL_GL_CreateContext(uVar2);
            in_RDI[2].m_DataBuffer.m_pData = puVar8;
            if (in_RDI[2].m_DataBuffer.m_pData == (uchar *)0x0) {
              uVar6 = SDL_GetError();
              dbg_msg("gfx","unable to create OpenGL context: %s",uVar6);
              local_94 = -1;
            }
            else {
              uVar3._0_4_ = in_RDI[2].m_CmdBuffer.m_Size;
              uVar3._4_4_ = in_RDI[2].m_CmdBuffer.m_Used;
              SDL_GL_GetDrawableSize(uVar3,in_R9,in_stack_00000008);
              SDL_GL_SetSwapInterval((in_stack_00000018 & 2) >> 1);
              uVar5 = 0;
              SDL_GL_MakeCurrent(0);
              SDL_GetVersion(&local_1b);
              uVar11 = (uint)local_19;
              uVar10 = (uint)local_1a;
              dbg_msg("sdl","SDL version %d.%d.%d (dll = %d.%d.%d)",2,0,0x14,(ulong)local_1b);
              pvVar9 = operator_new(0x20038);
              CCommandProcessor_SDL_OpenGL::CCommandProcessor_SDL_OpenGL
                        ((CCommandProcessor_SDL_OpenGL *)CONCAT44(uVar5,in_stack_ffffffffffffff00));
              *(void **)&in_RDI[2].m_DataBuffer.m_Size = pvVar9;
              CGraphicsBackend_Threaded::StartProcessor
                        ((CGraphicsBackend_Threaded *)CONCAT44(in_stack_fffffffffffffef4,uVar11),
                         (ICommandProcessor *)CONCAT44(in_stack_fffffffffffffeec,uVar10));
              CCommandBuffer::CCommandBuffer(in_RDI,(uint)((ulong)pvVar9 >> 0x20),(uint)pvVar9);
              CCommandProcessorFragment_SDL::CInitCommand::CInitCommand((CInitCommand *)0x11d5ee);
              CCommandBuffer::AddCommand<CCommandProcessorFragment_SDL::CInitCommand>
                        (in_stack_fffffffffffffef8,
                         (CInitCommand *)CONCAT44(in_stack_fffffffffffffef4,uVar11));
              CCommandProcessorFragment_OpenGL::CInitCommand::CInitCommand((CInitCommand *)0x11d631)
              ;
              CCommandBuffer::AddCommand<CCommandProcessorFragment_OpenGL::CInitCommand>
                        (in_stack_fffffffffffffef8,
                         (CInitCommand *)CONCAT44(in_stack_fffffffffffffef4,uVar11));
              (**(code **)((in_RDI->m_CmdBuffer).m_pData + 0x88))(in_RDI,local_50);
              (**(code **)((in_RDI->m_CmdBuffer).m_pData + 0x98))();
              local_94 = 0;
              CCommandBuffer::~CCommandBuffer
                        ((CCommandBuffer *)CONCAT44(in_stack_fffffffffffffef4,uVar11));
            }
          }
        }
      }
      else {
        uVar6 = SDL_GetError();
        dbg_msg("gfx","unable to retrieve screen information: %s",uVar6);
        local_94 = -1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_94;
}

Assistant:

int CGraphicsBackend_SDL_OpenGL::Init(const char *pName, int *pScreen, int *pWindowWidth, int *pWindowHeight, int* pScreenWidth, int* pScreenHeight, int FsaaSamples, int Flags, int *pDesktopWidth, int *pDesktopHeight)
{
	if(!SDL_WasInit(SDL_INIT_VIDEO))
	{
		if(SDL_InitSubSystem(SDL_INIT_VIDEO) < 0)
		{
			dbg_msg("gfx", "unable to init SDL video: %s", SDL_GetError());
			return -1;
		}
	}

	// set screen
	SDL_Rect ScreenPos;
	m_NumScreens = SDL_GetNumVideoDisplays();
	if(m_NumScreens > 0)
	{
		*pScreen = clamp(*pScreen, 0, m_NumScreens-1);
		if(SDL_GetDisplayBounds(*pScreen, &ScreenPos) != 0)
		{
			dbg_msg("gfx", "unable to retrieve screen information: %s", SDL_GetError());
			return -1;
		}
	}
	else
	{
		dbg_msg("gfx", "unable to retrieve number of screens: %s", SDL_GetError());
		return -1;
	}

	// store desktop resolution for settings reset button
	if(!GetDesktopResolution(*pScreen, pDesktopWidth, pDesktopHeight))
	{
		dbg_msg("gfx", "unable to get desktop resolution: %s", SDL_GetError());
		return -1;
	}

	// use desktop resolution as default resolution
	if (*pWindowWidth == 0 || *pWindowHeight == 0)
	{
		*pWindowWidth = *pDesktopWidth;
		*pWindowHeight = *pDesktopHeight;
	}

	// set flags
	int SdlFlags = SDL_WINDOW_OPENGL;
	if(Flags&IGraphicsBackend::INITFLAG_HIGHDPI)
		SdlFlags |= SDL_WINDOW_ALLOW_HIGHDPI;
	if(Flags&IGraphicsBackend::INITFLAG_RESIZABLE)
		SdlFlags |= SDL_WINDOW_RESIZABLE;
	if(Flags&IGraphicsBackend::INITFLAG_BORDERLESS)
		SdlFlags |= SDL_WINDOW_BORDERLESS;
	if(Flags&IGraphicsBackend::INITFLAG_FULLSCREEN)
#if defined(CONF_PLATFORM_MACOSX)	// Todo SDL: remove this when fixed (game freezes when losing focus in fullscreen)
	{
		SdlFlags |= SDL_WINDOW_FULLSCREEN_DESKTOP;	// always use "fake" fullscreen
		*pWindowWidth = *pDesktopWidth;
		*pWindowHeight = *pDesktopHeight;
	}
#else
		SdlFlags |= SDL_WINDOW_FULLSCREEN;
#endif

	if(Flags&IGraphicsBackend::INITFLAG_X11XRANDR)
		SDL_SetHint(SDL_HINT_VIDEO_X11_XRANDR, "1");

	// set gl attributes
	SDL_GL_SetAttribute(SDL_GL_DOUBLEBUFFER, 1);
	if(FsaaSamples)
	{
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLEBUFFERS, 1);
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLESAMPLES, FsaaSamples);
	}
	else
	{
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLEBUFFERS, 0);
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLESAMPLES, 0);
	}

	// calculate centered position in windowed mode
	int OffsetX = 0;
	int OffsetY = 0;
	if(!(Flags&IGraphicsBackend::INITFLAG_FULLSCREEN) && *pDesktopWidth > *pWindowWidth && *pDesktopHeight > *pWindowHeight)
	{
		OffsetX = (*pDesktopWidth - *pWindowWidth) / 2;
		OffsetY = (*pDesktopHeight - *pWindowHeight) / 2;
	}

	// create window
	m_pWindow = SDL_CreateWindow(pName, ScreenPos.x+OffsetX, ScreenPos.y+OffsetY, *pWindowWidth, *pWindowHeight, SdlFlags);
	if(m_pWindow == NULL)
	{
		dbg_msg("gfx", "unable to create window: %s", SDL_GetError());
		return -1;
	}

	SDL_GetWindowSize(m_pWindow, pWindowWidth, pWindowHeight);

	// create gl context
	m_GLContext = SDL_GL_CreateContext(m_pWindow);
	if(m_GLContext == NULL)
	{
		dbg_msg("gfx", "unable to create OpenGL context: %s", SDL_GetError());
		return -1;
	}

	SDL_GL_GetDrawableSize(m_pWindow, pScreenWidth, pScreenHeight); // drawable size may differ in high dpi mode

	#if defined(CONF_FAMILY_WINDOWS)
		glTexImage3DInternal = (PFNGLTEXIMAGE3DPROC) wglGetProcAddress("glTexImage3D");
		if(glTexImage3DInternal == 0)
		{
			dbg_msg("gfx", "glTexImage3D not supported");
			return -1;
		}
	#endif

	SDL_GL_SetSwapInterval(Flags&IGraphicsBackend::INITFLAG_VSYNC ? 1 : 0);

	SDL_GL_MakeCurrent(NULL, NULL);

	// print sdl version
	SDL_version Compiled;
	SDL_version Linked;

	SDL_VERSION(&Compiled);
	SDL_GetVersion(&Linked);
	dbg_msg("sdl", "SDL version %d.%d.%d (dll = %d.%d.%d)", Compiled.major, Compiled.minor, Compiled.patch, Linked.major, Linked.minor, Linked.patch);

	// start the command processor
	m_pProcessor = new CCommandProcessor_SDL_OpenGL;
	StartProcessor(m_pProcessor);

	// issue init commands for OpenGL and SDL
	CCommandBuffer CmdBuffer(1024, 512);
	CCommandProcessorFragment_SDL::CInitCommand CmdSDL;
	CmdSDL.m_pWindow = m_pWindow;
	CmdSDL.m_GLContext = m_GLContext;
	CmdBuffer.AddCommand(CmdSDL);
	CCommandProcessorFragment_OpenGL::CInitCommand CmdOpenGL;
	CmdOpenGL.m_pTextureMemoryUsage = &m_TextureMemoryUsage;
	CmdOpenGL.m_pTextureArraySize = &m_TextureArraySize;
	CmdBuffer.AddCommand(CmdOpenGL);
	RunBuffer(&CmdBuffer);
	WaitForIdle();

	return 0;
}